

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  stbi_uc *psVar9;
  ulong uVar10;
  byte bVar11;
  uint uVar12;
  stbi__uint32 sVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  stbi_uc *psVar20;
  uint uVar21;
  ulong uVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  long lVar26;
  byte bVar27;
  long lVar28;
  byte bVar29;
  long lVar30;
  ulong uVar31;
  stbi_uc *psVar32;
  uint uVar33;
  byte *pbVar34;
  uint uVar35;
  stbi_uc *psVar36;
  byte *pbVar37;
  bool bVar38;
  int local_d0;
  ulong local_68;
  ulong uVar19;
  
  bVar38 = depth == 0x10;
  uVar4 = x * out_n;
  uVar5 = uVar4 << bVar38;
  iVar2 = a->s->img_n;
  uVar6 = iVar2 << bVar38;
  if (iVar2 + 1 != out_n && iVar2 != out_n) {
    __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/extlibs/headers/stb_image/stb_image.h"
                  ,0x10c6,
                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                 );
  }
  local_d0 = 0;
  psVar9 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar38,0);
  a->out = psVar9;
  if (psVar9 == (stbi_uc *)0x0) {
    pcVar3 = "Out of memory";
  }
  else {
    uVar7 = iVar2 * x;
    uVar18 = uVar7 * depth + 7 >> 3;
    uVar19 = (ulong)uVar18;
    pcVar3 = "Corrupt PNG";
    if ((uVar18 + 1) * y <= raw_len) {
      if (y == 0) {
LAB_00127552:
        local_d0 = 1;
        pcVar3 = stbi__g_failure_reason;
        if (depth == 0x10) {
LAB_00127564:
          if (uVar4 * y == 0) {
LAB_00127592:
            local_d0 = 1;
            pcVar3 = stbi__g_failure_reason;
          }
          else {
            local_d0 = 1;
            psVar9 = a->out;
            lVar14 = 0;
            do {
              puVar1 = (ushort *)(psVar9 + lVar14 * 2);
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
              lVar14 = lVar14 + 1;
              pcVar3 = stbi__g_failure_reason;
            } while (uVar4 * y != (int)lVar14);
          }
        }
      }
      else {
        bVar27 = *raw;
        if (bVar27 < 5) {
          lVar14 = (long)iVar2;
          lVar15 = (long)(out_n << bVar38);
          iVar8 = x - 1;
          uVar10 = (ulong)y;
          psVar9 = a->out;
          lVar16 = -lVar15;
          lVar26 = -(ulong)uVar5;
          uVar22 = 0;
          local_68 = (ulong)x;
          lVar28 = 0;
          do {
            if (depth < 8) {
              if (x < uVar18) {
                __assert_fail("img_width_bytes <= x",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/extlibs/headers/stb_image/stb_image.h"
                              ,0x10da,
                              "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                             );
              }
              psVar9 = psVar9 + (uVar4 - uVar18);
              uVar6 = 1;
              local_68 = uVar19;
            }
            if (lVar28 == 0) {
              bVar27 = ""[bVar27];
            }
            if (0 < (int)uVar6) {
              uVar31 = 0;
              do {
                switch(bVar27) {
                case 0:
                case 1:
                case 5:
                case 6:
                  bVar11 = raw[uVar31 + 1];
                  goto LAB_00126b76;
                case 2:
                case 4:
                  bVar11 = psVar9[uVar31 + lVar26];
                  break;
                case 3:
                  bVar11 = psVar9[uVar31 + lVar26] >> 1;
                  break;
                default:
                  goto switchD_00126b5e_default;
                }
                bVar11 = bVar11 + raw[uVar31 + 1];
LAB_00126b76:
                psVar9[uVar31] = bVar11;
switchD_00126b5e_default:
                uVar31 = uVar31 + 1;
              } while (uVar6 != uVar31);
            }
            if (depth == 8) {
              lVar30 = (long)out_n;
              lVar17 = lVar14;
              if (iVar2 != out_n) {
                psVar9[lVar14] = 0xff;
              }
LAB_00126bdd:
              raw = raw + lVar17 + 1;
            }
            else {
              if (depth == 0x10) {
                lVar17 = (long)(int)uVar6;
                lVar30 = lVar15;
                if (iVar2 != out_n) {
                  psVar9[lVar17] = 0xff;
                  psVar9[lVar17 + 1] = 0xff;
                }
                goto LAB_00126bdd;
              }
              raw = raw + 2;
              lVar30 = 1;
            }
            psVar36 = psVar9 + lVar30;
            if (depth < 8 || iVar2 == out_n) {
              uVar12 = ((int)local_68 + -1) * uVar6;
              switch(bVar27) {
              case 0:
                memcpy(psVar36,raw,(long)(int)uVar12);
                break;
              case 1:
                if (0 < (int)uVar12) {
                  uVar22 = 0;
                  do {
                    psVar36[uVar22] = psVar9[uVar22 + (lVar30 - (int)uVar6)] + raw[uVar22];
                    uVar22 = uVar22 + 1;
                  } while (uVar12 != uVar22);
                }
                break;
              case 2:
                if (0 < (int)uVar12) {
                  uVar22 = 0;
                  do {
                    psVar36[uVar22] = psVar36[uVar22 + lVar26] + raw[uVar22];
                    uVar22 = uVar22 + 1;
                  } while (uVar12 != uVar22);
                }
                break;
              case 3:
                if (0 < (int)uVar12) {
                  uVar22 = 0;
                  do {
                    psVar36[uVar22] =
                         (char)((uint)psVar9[uVar22 + (lVar30 - (int)uVar6)] +
                                (uint)psVar36[uVar22 + lVar26] >> 1) + raw[uVar22];
                    uVar22 = uVar22 + 1;
                  } while (uVar12 != uVar22);
                }
                break;
              case 4:
                if (0 < (int)uVar12) {
                  pbVar37 = psVar9 + (lVar30 - (int)uVar6);
                  uVar22 = 0;
                  do {
                    bVar27 = *pbVar37;
                    bVar11 = psVar36[lVar26];
                    bVar29 = pbVar37[lVar26];
                    iVar23 = ((uint)bVar11 + (uint)bVar27) - (uint)bVar29;
                    uVar33 = iVar23 - (uint)bVar27;
                    uVar35 = -uVar33;
                    if (0 < (int)uVar33) {
                      uVar35 = uVar33;
                    }
                    uVar21 = iVar23 - (uint)bVar11;
                    uVar33 = -uVar21;
                    if (0 < (int)uVar21) {
                      uVar33 = uVar21;
                    }
                    uVar24 = iVar23 - (uint)bVar29;
                    uVar21 = -uVar24;
                    if (0 < (int)uVar24) {
                      uVar21 = uVar24;
                    }
                    if (uVar33 <= uVar21) {
                      bVar29 = bVar11;
                    }
                    if (uVar21 < uVar35) {
                      bVar27 = bVar29;
                    }
                    if (uVar33 < uVar35) {
                      bVar27 = bVar29;
                    }
                    *psVar36 = bVar27 + raw[uVar22];
                    uVar22 = uVar22 + 1;
                    pbVar37 = pbVar37 + 1;
                    psVar36 = psVar36 + 1;
                  } while (uVar12 != uVar22);
                }
                break;
              case 5:
                if (0 < (int)uVar12) {
                  uVar22 = 0;
                  do {
                    psVar36[uVar22] = (psVar9[uVar22 + (lVar30 - (int)uVar6)] >> 1) + raw[uVar22];
                    uVar22 = uVar22 + 1;
                  } while (uVar12 != uVar22);
                }
                break;
              case 6:
                if (0 < (int)uVar12) {
                  uVar22 = 0;
                  do {
                    psVar36[uVar22] = psVar9[uVar22 + (lVar30 - (int)uVar6)] + raw[uVar22];
                    uVar22 = uVar22 + 1;
                  } while (uVar12 != uVar22);
                }
              }
              raw = raw + (int)uVar12;
LAB_00127102:
              if (lVar28 + 1U == uVar10) {
                if (7 < depth) goto LAB_00127552;
                if (y != 0) {
                  uVar18 = x - 1;
                  lVar15 = uVar4 - uVar19;
                  lVar14 = (ulong)uVar18 + 1;
                  uVar6 = 0;
                  uVar22 = 0;
                  do {
                    bVar27 = 1;
                    if (color == 0) {
                      bVar27 = ""[depth];
                    }
                    psVar9 = a->out;
                    pbVar34 = psVar9 + uVar5 * (int)uVar22;
                    pbVar37 = pbVar34 + (uVar4 - uVar19);
                    uVar31 = (ulong)uVar6;
                    if (depth == 4) {
                      uVar12 = uVar7;
                      if (1 < (int)uVar7) {
                        psVar36 = psVar9 + lVar15;
                        uVar35 = uVar7;
                        do {
                          psVar9[uVar31] = (psVar36[uVar31] >> 4) * bVar27;
                          psVar9[uVar31 + 1] = (psVar36[uVar31] & 0xf) * bVar27;
                          uVar12 = uVar35 - 2;
                          psVar36 = psVar36 + 1;
                          psVar9 = psVar9 + 2;
                          bVar38 = 3 < uVar35;
                          uVar35 = uVar12;
                        } while (bVar38);
                        pbVar37 = psVar36 + uVar31;
                        pbVar34 = psVar9 + uVar31;
                      }
                      if (uVar12 == 1) {
                        *pbVar34 = (*pbVar37 >> 4) * bVar27;
                      }
                    }
                    else if (depth == 2) {
                      uVar12 = uVar7;
                      if (3 < (int)uVar7) {
                        psVar36 = psVar9 + lVar15;
                        uVar35 = uVar7;
                        do {
                          psVar9[uVar31] = (psVar36[uVar31] >> 6) * bVar27;
                          psVar9[uVar31 + 1] = (psVar36[uVar31] >> 4 & 3) * bVar27;
                          psVar9[uVar31 + 2] = (psVar36[uVar31] >> 2 & 3) * bVar27;
                          psVar9[uVar31 + 3] = (psVar36[uVar31] & 3) * bVar27;
                          uVar12 = uVar35 - 4;
                          psVar36 = psVar36 + 1;
                          psVar9 = psVar9 + 4;
                          bVar38 = 7 < uVar35;
                          uVar35 = uVar12;
                        } while (bVar38);
                        pbVar37 = psVar36 + uVar31;
                        pbVar34 = psVar9 + uVar31;
                      }
                      if (((0 < (int)uVar12) && (*pbVar34 = (*pbVar37 >> 6) * bVar27, uVar12 != 1))
                         && (pbVar34[1] = (*pbVar37 >> 4 & 3) * bVar27, uVar12 == 3)) {
                        pbVar34[2] = (*pbVar37 >> 2 & 3) * bVar27;
                      }
                    }
                    else if (depth == 1) {
                      uVar12 = uVar7;
                      if (7 < (int)uVar7) {
                        psVar36 = psVar9 + lVar15;
                        uVar35 = uVar7;
                        do {
                          psVar9[uVar31] = (char)psVar36[uVar31] >> 7 & bVar27;
                          psVar9[uVar31 + 1] = (char)(psVar36[uVar31] * '\x02') >> 7 & bVar27;
                          psVar9[uVar31 + 2] = (char)(psVar36[uVar31] << 2) >> 7 & bVar27;
                          psVar9[uVar31 + 3] = (char)(psVar36[uVar31] << 3) >> 7 & bVar27;
                          psVar9[uVar31 + 4] = (char)(psVar36[uVar31] << 4) >> 7 & bVar27;
                          psVar9[uVar31 + 5] = (char)(psVar36[uVar31] << 5) >> 7 & bVar27;
                          psVar9[uVar31 + 6] = (char)(psVar36[uVar31] << 6) >> 7 & bVar27;
                          bVar11 = bVar27;
                          if ((psVar36[uVar31] & 1) == 0) {
                            bVar11 = 0;
                          }
                          psVar9[uVar31 + 7] = bVar11;
                          uVar12 = uVar35 - 8;
                          psVar36 = psVar36 + 1;
                          psVar9 = psVar9 + 8;
                          bVar38 = 0xf < uVar35;
                          uVar35 = uVar12;
                        } while (bVar38);
                        pbVar37 = psVar36 + uVar31;
                        pbVar34 = psVar9 + uVar31;
                      }
                      if (((((0 < (int)uVar12) &&
                            (*pbVar34 = (char)*pbVar37 >> 7 & bVar27, uVar12 != 1)) &&
                           ((pbVar34[1] = (char)(*pbVar37 * '\x02') >> 7 & bVar27, 2 < uVar12 &&
                            ((pbVar34[2] = (char)(*pbVar37 << 2) >> 7 & bVar27, uVar12 != 3 &&
                             (pbVar34[3] = (char)(*pbVar37 << 3) >> 7 & bVar27, 4 < uVar12)))))) &&
                          (pbVar34[4] = (char)(*pbVar37 << 4) >> 7 & bVar27, uVar12 != 5)) &&
                         (pbVar34[5] = (char)(*pbVar37 << 5) >> 7 & bVar27, uVar12 == 7)) {
                        pbVar34[6] = (char)(*pbVar37 << 6) >> 7 & bVar27;
                      }
                    }
                    if (iVar2 != out_n) {
                      psVar9 = a->out;
                      if (iVar2 == 1) {
                        lVar16 = lVar14;
                        if (-1 < (int)uVar18) {
                          do {
                            psVar9[lVar16 * 2 + (uVar31 - 1)] = 0xff;
                            psVar9[lVar16 * 2 + (uVar31 - 2)] = psVar9[lVar16 + (uVar31 - 1)];
                            lVar26 = lVar16 + -1;
                            bVar38 = 0 < lVar16;
                            lVar16 = lVar26;
                          } while (lVar26 != 0 && bVar38);
                        }
                      }
                      else {
                        if (iVar2 != 3) {
                          __assert_fail("img_n == 3",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/extlibs/headers/stb_image/stb_image.h"
                                        ,0x1171,
                                        "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                                       );
                        }
                        if (-1 < (int)uVar18) {
                          psVar36 = psVar9 + (ulong)uVar18 * 3 + 2 + uVar31;
                          lVar16 = lVar14;
                          do {
                            psVar9[lVar16 * 4 + (uVar31 - 1)] = 0xff;
                            psVar9[lVar16 * 4 + (uVar31 - 2)] = *psVar36;
                            psVar9[lVar16 * 4 + (uVar31 - 3)] = psVar36[-1];
                            psVar9[lVar16 * 4 + (uVar31 - 4)] = psVar36[-2];
                            psVar36 = psVar36 + -3;
                            lVar26 = lVar16 + -1;
                            bVar38 = 0 < lVar16;
                            lVar16 = lVar26;
                          } while (lVar26 != 0 && bVar38);
                        }
                      }
                    }
                    uVar22 = uVar22 + 1;
                    uVar6 = uVar6 + uVar5;
                  } while (uVar22 != uVar10);
                  return 1;
                }
                goto LAB_00127592;
              }
            }
            else {
              if (iVar2 + 1 != out_n) {
                __assert_fail("img_n+1 == out_n",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/extlibs/headers/stb_image/stb_image.h"
                              ,0x1118,
                              "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                             );
              }
              switch(bVar27) {
              case 0:
                if (iVar8 != 0) {
                  iVar23 = iVar8;
                  do {
                    if (0 < (int)uVar6) {
                      uVar31 = 0;
                      do {
                        psVar36[uVar31] = raw[uVar31];
                        uVar31 = uVar31 + 1;
                      } while (uVar6 != uVar31);
                    }
                    psVar36[(int)uVar6] = 0xff;
                    raw = raw + (int)uVar6;
                    psVar36 = psVar36 + lVar15;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                break;
              case 1:
                if (iVar8 != 0) {
                  psVar9 = psVar9 + lVar30 + lVar16;
                  iVar23 = iVar8;
                  do {
                    if (0 < (int)uVar6) {
                      uVar31 = 0;
                      do {
                        psVar36[uVar31] = psVar9[uVar31] + raw[uVar31];
                        uVar31 = uVar31 + 1;
                      } while (uVar6 != uVar31);
                    }
                    psVar36[(int)uVar6] = 0xff;
                    raw = raw + (int)uVar6;
                    psVar36 = psVar36 + lVar15;
                    psVar9 = psVar9 + lVar15;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                break;
              case 2:
                if (iVar8 != 0) {
                  iVar23 = iVar8;
                  do {
                    if (0 < (int)uVar6) {
                      uVar31 = 0;
                      do {
                        psVar36[uVar31] = psVar36[uVar31 + lVar26] + raw[uVar31];
                        uVar31 = uVar31 + 1;
                      } while (uVar6 != uVar31);
                    }
                    psVar36[(int)uVar6] = 0xff;
                    raw = raw + (int)uVar6;
                    psVar36 = psVar36 + lVar15;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                break;
              case 3:
                if (iVar8 != 0) {
                  iVar23 = iVar8;
                  do {
                    if (0 < (int)uVar6) {
                      uVar31 = 0;
                      psVar9 = psVar36;
                      do {
                        *psVar9 = (char)((uint)psVar9[lVar16] + (uint)psVar9[lVar26] >> 1) +
                                  raw[uVar31];
                        uVar31 = uVar31 + 1;
                        psVar9 = psVar9 + 1;
                      } while (uVar6 != uVar31);
                    }
                    psVar36[(int)uVar6] = 0xff;
                    raw = raw + (int)uVar6;
                    psVar36 = psVar36 + lVar15;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                break;
              case 4:
                if (iVar8 != 0) {
                  psVar20 = psVar9 + lVar30 + lVar26;
                  psVar32 = psVar9 + lVar30 + lVar16;
                  psVar9 = psVar9 + lVar30 + (lVar16 - (ulong)uVar5);
                  iVar23 = iVar8;
                  do {
                    if (0 < (int)uVar6) {
                      uVar31 = 0;
                      do {
                        bVar27 = psVar32[uVar31];
                        bVar11 = psVar20[uVar31];
                        bVar29 = psVar9[uVar31];
                        iVar25 = ((uint)bVar11 + (uint)bVar27) - (uint)bVar29;
                        uVar35 = iVar25 - (uint)bVar27;
                        uVar12 = -uVar35;
                        if (0 < (int)uVar35) {
                          uVar12 = uVar35;
                        }
                        uVar33 = iVar25 - (uint)bVar11;
                        uVar35 = -uVar33;
                        if (0 < (int)uVar33) {
                          uVar35 = uVar33;
                        }
                        uVar21 = iVar25 - (uint)bVar29;
                        uVar33 = -uVar21;
                        if (0 < (int)uVar21) {
                          uVar33 = uVar21;
                        }
                        if (uVar35 <= uVar33) {
                          bVar29 = bVar11;
                        }
                        if (uVar33 < uVar12) {
                          bVar27 = bVar29;
                        }
                        if (uVar35 < uVar12) {
                          bVar27 = bVar29;
                        }
                        psVar36[uVar31] = bVar27 + raw[uVar31];
                        uVar31 = uVar31 + 1;
                      } while (uVar6 != uVar31);
                    }
                    psVar36[(int)uVar6] = 0xff;
                    raw = raw + (int)uVar6;
                    psVar36 = psVar36 + lVar15;
                    psVar20 = psVar20 + lVar15;
                    psVar32 = psVar32 + lVar15;
                    psVar9 = psVar9 + lVar15;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                break;
              case 5:
                if (iVar8 != 0) {
                  psVar9 = psVar9 + lVar30 + lVar16;
                  iVar23 = iVar8;
                  do {
                    if (0 < (int)uVar6) {
                      uVar31 = 0;
                      do {
                        psVar36[uVar31] = (psVar9[uVar31] >> 1) + raw[uVar31];
                        uVar31 = uVar31 + 1;
                      } while (uVar6 != uVar31);
                    }
                    psVar36[(int)uVar6] = 0xff;
                    raw = raw + (int)uVar6;
                    psVar36 = psVar36 + lVar15;
                    psVar9 = psVar9 + lVar15;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
                break;
              case 6:
                if (iVar8 != 0) {
                  psVar9 = psVar9 + lVar30 + lVar16;
                  iVar23 = iVar8;
                  do {
                    if (0 < (int)uVar6) {
                      uVar31 = 0;
                      do {
                        psVar36[uVar31] = psVar9[uVar31] + raw[uVar31];
                        uVar31 = uVar31 + 1;
                      } while (uVar6 != uVar31);
                    }
                    psVar36[(int)uVar6] = 0xff;
                    raw = raw + (int)uVar6;
                    psVar36 = psVar36 + lVar15;
                    psVar9 = psVar9 + lVar15;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
              }
              if (depth != 0x10) goto LAB_00127102;
              if (x != 0) {
                psVar9 = a->out + (long)(int)uVar6 + uVar22 + 1;
                sVar13 = x;
                do {
                  *psVar9 = 0xff;
                  psVar9 = psVar9 + lVar15;
                  sVar13 = sVar13 - 1;
                } while (sVar13 != 0);
                goto LAB_00127102;
              }
              if (lVar28 + 1U == uVar10) goto LAB_00127564;
            }
            lVar28 = lVar28 + 1;
            uVar22 = (ulong)(uVar5 * (int)lVar28);
            psVar9 = a->out + uVar22;
            bVar27 = *raw;
          } while (bVar27 < 5);
        }
        pcVar3 = "Corrupt PNG";
      }
    }
  }
  stbi__g_failure_reason = pcVar3;
  return local_d0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;
   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }